

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void lower_bound_sorted_suite::find_even_first_predicate(void)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  array<int,_4UL> storage;
  int *local_50;
  int local_48 [4];
  int *local_38;
  
  piVar3 = local_48 + 2;
  local_48[0] = 0x2c;
  local_48[1] = 0x21;
  local_48[2] = 0x16;
  local_48[3] = 0xb;
  piVar5 = local_48 + 3;
  piVar1 = local_48 + 1;
  local_50 = local_48;
  local_38 = local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 45, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3dd,"void lower_bound_sorted_suite::find_even_first_predicate()",&local_50,&local_38
            );
  piVar4 = piVar1;
  piVar2 = local_48;
  if (0x2c < local_48[2]) {
    piVar4 = piVar5;
    piVar2 = piVar3;
  }
  local_50 = piVar2 + (0x2c < *piVar4) + (0x2c < piVar2[0x2c < *piVar4]);
  local_38 = local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 44, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3df,"void lower_bound_sorted_suite::find_even_first_predicate()",&local_50,&local_38
            );
  if (local_48[2] < 0x2c) {
    piVar5 = piVar1;
    piVar3 = local_48;
  }
  local_50 = piVar3 + (0x2b < *piVar5) + (0x2b < piVar3[0x2b < *piVar5]);
  local_38 = piVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 43, std::greater<int>{})",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3e1,"void lower_bound_sorted_suite::find_even_first_predicate()",&local_50,&local_38
            );
  return;
}

Assistant:

void find_even_first_predicate()
{
    std::array<int, 4> storage = { 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 45, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 44, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 43, std::greater<int>{}),
                  std::next(storage.begin(), 1));
}